

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImageBase.cpp
# Opt level: O0

vector<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_> * __thiscall
myvk::ImageBase::GetMemoryBarriers
          (ImageBase *this,
          vector<VkImageSubresourceRange,_std::allocator<VkImageSubresourceRange>_> *regions,
          VkAccessFlags src_access_mask,VkAccessFlags dst_access_mask,VkImageLayout old_layout,
          VkImageLayout new_layout,uint32_t src_queue_family,uint32_t dst_queue_family)

{
  uint32_t uVar1;
  vector<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_> *this_00;
  size_type sVar2;
  reference pvVar3;
  const_reference pvVar4;
  VkAccessFlags in_ECX;
  vector<VkImageSubresourceRange,_std::allocator<VkImageSubresourceRange>_> *in_RDX;
  allocator_type *in_RSI;
  vector<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_> *in_RDI;
  VkAccessFlags in_R8D;
  VkImageLayout in_R9D;
  VkImageLayout in_stack_00000008;
  uint32_t in_stack_00000010;
  uint32_t in_stack_00000018;
  VkImageMemoryBarrier *cur;
  uint32_t i;
  vector<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_> *barriers;
  vector<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_> *this_01;
  uint local_38;
  allocator<VkImageMemoryBarrier> local_26;
  undefined1 local_25;
  VkImageLayout local_24;
  VkAccessFlags local_20;
  VkAccessFlags local_1c;
  vector<VkImageSubresourceRange,_std::allocator<VkImageSubresourceRange>_> *local_18;
  
  local_25 = 0;
  this_01 = in_RDI;
  local_24 = in_R9D;
  local_20 = in_R8D;
  local_1c = in_ECX;
  local_18 = in_RDX;
  this_00 = (vector<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_> *)
            std::vector<VkImageSubresourceRange,_std::allocator<VkImageSubresourceRange>_>::size
                      (in_RDX);
  std::allocator<VkImageMemoryBarrier>::allocator((allocator<VkImageMemoryBarrier> *)0x2a65c0);
  std::vector<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>::vector
            (this_00,(size_type)this_01,in_RSI);
  std::allocator<VkImageMemoryBarrier>::~allocator(&local_26);
  for (local_38 = 0;
      sVar2 = std::vector<VkImageSubresourceRange,_std::allocator<VkImageSubresourceRange>_>::size
                        (local_18), local_38 < sVar2; local_38 = local_38 + 1) {
    pvVar3 = std::vector<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>::operator[]
                       (this_01,(ulong)local_38);
    pvVar3->sType = VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER;
    pvVar3->image = *(VkImage *)(in_RSI + 0x18);
    pvVar3->oldLayout = local_24;
    pvVar3->newLayout = in_stack_00000008;
    pvVar3->srcAccessMask = local_1c;
    pvVar3->dstAccessMask = local_20;
    pvVar3->srcQueueFamilyIndex = in_stack_00000010;
    pvVar3->dstQueueFamilyIndex = in_stack_00000018;
    pvVar4 = std::vector<VkImageSubresourceRange,_std::allocator<VkImageSubresourceRange>_>::
             operator[](local_18,(ulong)local_38);
    uVar1 = pvVar4->baseMipLevel;
    (pvVar3->subresourceRange).aspectMask = pvVar4->aspectMask;
    (pvVar3->subresourceRange).baseMipLevel = uVar1;
    uVar1 = pvVar4->baseArrayLayer;
    (pvVar3->subresourceRange).levelCount = pvVar4->levelCount;
    (pvVar3->subresourceRange).baseArrayLayer = uVar1;
    (pvVar3->subresourceRange).layerCount = pvVar4->layerCount;
  }
  return in_RDI;
}

Assistant:

std::vector<VkImageMemoryBarrier> ImageBase::GetMemoryBarriers(const std::vector<VkImageSubresourceRange> &regions,
                                                               VkAccessFlags src_access_mask,
                                                               VkAccessFlags dst_access_mask, VkImageLayout old_layout,
                                                               VkImageLayout new_layout, uint32_t src_queue_family,
                                                               uint32_t dst_queue_family) const {
	std::vector<VkImageMemoryBarrier> barriers(regions.size());
	for (uint32_t i = 0; i < regions.size(); ++i) {
		VkImageMemoryBarrier &cur = barriers[i];
		cur.sType = VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER;
		cur.image = m_image;
		cur.oldLayout = old_layout;
		cur.newLayout = new_layout;
		cur.srcAccessMask = src_access_mask;
		cur.dstAccessMask = dst_access_mask;
		cur.srcQueueFamilyIndex = src_queue_family;
		cur.dstQueueFamilyIndex = dst_queue_family;
		cur.subresourceRange = regions[i];
	}
	return barriers;
}